

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

ParseStatus
re2::ParseUnicodeGroup
          (StringPiece *s,ParseFlags parse_flags,CharClassBuilder *cc,RegexpStatus *status)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  undefined1 *g;
  uint sign;
  Rune c;
  int local_6c;
  StringPiece local_68;
  StringPiece local_58;
  StringPiece local_40;
  
  if ((parse_flags >> 10 & 1) == 0) {
    return kParseNothing;
  }
  if (s->length_ < 2) {
    return kParseNothing;
  }
  pcVar2 = s->ptr_;
  if (*pcVar2 != '\\') {
    return kParseNothing;
  }
  bVar1 = pcVar2[1];
  local_6c = (int)(char)bVar1;
  if ((bVar1 & 0xdf) != 0x50) {
    return kParseNothing;
  }
  local_58.ptr_ = s->ptr_;
  local_58.length_ = s->length_;
  local_58._12_4_ = *(undefined4 *)&s->field_0xc;
  local_68.ptr_ = (char *)0x0;
  local_68.length_ = 0;
  s->ptr_ = pcVar2 + 2;
  s->length_ = s->length_ + -2;
  iVar4 = StringPieceToRune(&local_6c,s,status);
  if (iVar4 == 0) {
    return kParseError;
  }
  if (local_6c == 0x7b) {
    sVar5 = StringPiece::find(s,'}',0);
    if (sVar5 == 0xffffffffffffffff) {
      bVar3 = IsValidUTF8(&local_58,status);
      if (!bVar3) {
        return kParseError;
      }
      goto LAB_001126f0;
    }
    local_68.ptr_ = s->ptr_;
    local_68.length_ = (int)sVar5;
    s->ptr_ = local_68.ptr_ + (long)local_68.length_ + 1;
    s->length_ = s->length_ + ~local_68.length_;
    bVar3 = IsValidUTF8(&local_68,status);
    if (!bVar3) {
      return kParseError;
    }
  }
  else {
    local_68.ptr_ = local_58.ptr_ + 2;
    local_68.length_ = *(int *)&s->ptr_ - (int)local_68.ptr_;
  }
  sign = (uint)(bVar1 != 0x50) * 2 - 1;
  local_58.length_ = *(int *)&s->ptr_ - (int)local_58.ptr_;
  if ((0 < local_68.length_) && (*local_68.ptr_ == '^')) {
    sign = -(uint)(bVar1 != 0x50) | 1;
    local_68.ptr_ = local_68.ptr_ + 1;
    local_68.length_ = local_68.length_ - 1;
  }
  local_40.ptr_ = "Any";
  local_40.length_ = 3;
  bVar3 = StringPiece::_equal(&local_68,&local_40);
  if (bVar3) {
    g = anygroup;
  }
  else {
    g = (undefined1 *)LookupGroup(&local_68,(UGroup *)unicode_groups,0xa7);
  }
  if ((UGroup *)g != (UGroup *)0x0) {
    AddUGroup(cc,(UGroup *)g,sign,parse_flags);
    return kParseOk;
  }
LAB_001126f0:
  status->code_ = kRegexpBadCharRange;
  (status->error_arg_).ptr_ = local_58.ptr_;
  (status->error_arg_).length_ = local_58.length_;
  return kParseError;
}

Assistant:

ParseStatus ParseUnicodeGroup(StringPiece* s, Regexp::ParseFlags parse_flags,
                              CharClassBuilder *cc,
                              RegexpStatus* status) {
  // Decide whether to parse.
  if (!(parse_flags & Regexp::UnicodeGroups))
    return kParseNothing;
  if (s->size() < 2 || (*s)[0] != '\\')
    return kParseNothing;
  Rune c = (*s)[1];
  if (c != 'p' && c != 'P')
    return kParseNothing;

  // Committed to parse.  Results:
  int sign = +1;  // -1 = negated char class
  if (c == 'P')
    sign = -sign;
  StringPiece seq = *s;  // \p{Han} or \pL
  StringPiece name;  // Han or L
  s->remove_prefix(2);  // '\\', 'p'

  if (!StringPieceToRune(&c, s, status))
    return kParseError;
  if (c != '{') {
    // Name is the bit of string we just skipped over for c.
    const char* p = seq.begin() + 2;
    name = StringPiece(p, static_cast<int>(s->begin() - p));
  } else {
    // Name is in braces. Look for closing }
    size_t end = s->find('}', 0);
    if (end == s->npos) {
      if (!IsValidUTF8(seq, status))
        return kParseError;
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(seq);
      return kParseError;
    }
    name = StringPiece(s->begin(), static_cast<int>(end));  // without '}'
    s->remove_prefix(static_cast<int>(end) + 1);  // with '}'
    if (!IsValidUTF8(name, status))
      return kParseError;
  }

  // Chop seq where s now begins.
  seq = StringPiece(seq.begin(), static_cast<int>(s->begin() - seq.begin()));

  if (name.size() > 0 && name[0] == '^') {
    sign = -sign;
    name.remove_prefix(1);  // '^'
  }

#if !defined(RE2_USE_ICU)
  // Look up the group in the RE2 Unicode data.
  const UGroup *g = LookupUnicodeGroup(name);
  if (g == NULL) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  AddUGroup(cc, g, sign, parse_flags);
#else
  // Look up the group in the ICU Unicode data. Because ICU provides full
  // Unicode properties support, this could be more than a lookup by name.
  ::icu::UnicodeString ustr = ::icu::UnicodeString::fromUTF8(
      string("\\p{") + name.ToString() + string("}"));
  UErrorCode uerr = U_ZERO_ERROR;
  ::icu::UnicodeSet uset(ustr, uerr);
  if (U_FAILURE(uerr)) {
    status->set_code(kRegexpBadCharRange);
    status->set_error_arg(seq);
    return kParseError;
  }

  // Convert the UnicodeSet to a URange32 and UGroup that we can add.
  int nr = uset.getRangeCount();
  URange32* r = new URange32[nr];
  for (int i = 0; i < nr; i++) {
    r[i].lo = uset.getRangeStart(i);
    r[i].hi = uset.getRangeEnd(i);
  }
  UGroup g = {"", +1, 0, 0, r, nr};
  AddUGroup(cc, &g, sign, parse_flags);
  delete[] r;
#endif

  return kParseOk;
}